

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputConverter.cxx
# Opt level: O0

bool cmOutputConverterNotAbove(char *a,char *b)

{
  char *pcVar1;
  bool bVar2;
  bool local_f2;
  allocator local_c9;
  string local_c8;
  byte local_a3;
  byte local_a2;
  allocator local_a1;
  string local_a0;
  allocator local_79;
  string local_78;
  allocator local_41;
  string local_40;
  char *local_20;
  char *b_local;
  char *a_local;
  
  local_20 = b;
  b_local = a;
  std::allocator<char>::allocator();
  local_a2 = 0;
  local_a3 = 0;
  std::__cxx11::string::string((string *)&local_40,a,&local_41);
  pcVar1 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_78,pcVar1,&local_79);
  bVar2 = cmsys::SystemTools::ComparePath(&local_40,&local_78);
  pcVar1 = b_local;
  local_f2 = true;
  if (!bVar2) {
    std::allocator<char>::allocator();
    local_a2 = 1;
    std::__cxx11::string::string((string *)&local_a0,pcVar1,&local_a1);
    pcVar1 = local_20;
    local_a3 = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_c8,pcVar1,&local_c9);
    local_f2 = cmsys::SystemTools::IsSubDirectory(&local_a0,&local_c8);
  }
  a_local._7_1_ = local_f2;
  if (!bVar2) {
    std::__cxx11::string::~string((string *)&local_c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  }
  if ((local_a3 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_a0);
  }
  if ((local_a2 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  }
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  return (bool)(a_local._7_1_ & 1);
}

Assistant:

static bool cmOutputConverterNotAbove(const char* a, const char* b)
{
  return (cmSystemTools::ComparePath(a, b) ||
          cmSystemTools::IsSubDirectory(a, b));
}